

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

bool __thiscall QPDF::allowModifyAll(QPDF *this)

{
  bool bVar1;
  int P;
  int R;
  encryption_method_e file;
  encryption_method_e string;
  encryption_method_e stream;
  int V;
  uint local_18;
  int local_14;
  encryption_method_e local_10;
  encryption_method_e local_c;
  encryption_method_e local_8;
  int local_4;
  
  local_14 = 0;
  local_18 = 0;
  bVar1 = isEncrypted(this,&local_14,(int *)&local_18,&local_4,&local_8,&local_c,&local_10);
  if (!bVar1) {
    return true;
  }
  if ((local_18 & 8) != 0) {
    if ((local_18 & 0x20) == 0 || local_14 < 3) {
      return (bool)((byte)local_18 >> 5 & local_14 < 3);
    }
    if ((local_18 >> 8 & 1) != 0) {
      return (bool)((byte)(local_18 >> 10) & 1);
    }
  }
  return false;
}

Assistant:

bool
QPDF::allowModifyAll()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = (is_bit_set(P, 4) && is_bit_set(P, 6));
        if (R >= 3) {
            status = status && (is_bit_set(P, 9) && is_bit_set(P, 11));
        }
    }
    return status;
}